

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCMaterial.cpp
# Opt level: O0

int Assimp::IFC::ConvertShadingMode(string *name)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  format local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  string *name_local;
  
  local_18 = name;
  bVar1 = std::operator==(name,"BLINN");
  if (bVar1) {
    name_local._4_4_ = 4;
  }
  else {
    bVar1 = std::operator==(local_18,"FLAT");
    if ((!bVar1) && (bVar1 = std::operator==(local_18,"NOTDEFINED"), !bVar1)) {
      bVar1 = std::operator==(local_18,"PHONG");
      if (!bVar1) {
        std::operator+(&local_1d0,"shading mode ",local_18);
        std::operator+(&local_1b0,&local_1d0," not recognized by Assimp, using Phong instead");
        Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
        basic_formatter<std::__cxx11::string>
                  ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&local_190,
                   &local_1b0);
        LogFunctions<Assimp::IFCImporter>::LogWarn(&local_190);
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        ~basic_formatter(&local_190);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::__cxx11::string::~string((string *)&local_1d0);
        return 3;
      }
      return 3;
    }
    name_local._4_4_ = 9;
  }
  return name_local._4_4_;
}

Assistant:

static int ConvertShadingMode(const std::string& name) {
    if (name == "BLINN") {
        return aiShadingMode_Blinn;
    }
    else if (name == "FLAT" || name == "NOTDEFINED") {
        return aiShadingMode_NoShading;
    }
    else if (name == "PHONG") {
        return aiShadingMode_Phong;
    }
    IFCImporter::LogWarn("shading mode "+name+" not recognized by Assimp, using Phong instead");
    return aiShadingMode_Phong;
}